

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O0

bool __thiscall luna::Table::NextKeyValue(Table *this,Value *key,Value *next_key,Value *next_value)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  type this_00;
  reference pvVar4;
  unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
  *this_01;
  pointer ppVar5;
  anon_union_8_9_8deb4486_for_Value_0 *in_RCX;
  anon_union_8_9_8deb4486_for_Value_0 *in_RDX;
  double *in_RSI;
  undefined1 auVar6 [16];
  iterator it;
  size_t index;
  unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
  *in_stack_ffffffffffffff88;
  uint6 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff96;
  bool bVar7;
  undefined1 in_stack_ffffffffffffff97;
  byte bVar8;
  _Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true> local_58;
  _Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true> local_50;
  _Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true> local_48;
  _Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true> local_40;
  _Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true> local_38;
  ulong local_30;
  anon_union_8_9_8deb4486_for_Value_0 *local_28;
  anon_union_8_9_8deb4486_for_Value_0 *local_20;
  double *local_18;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  if ((((*(int *)(in_RSI + 1) == 2) &&
       (local_18 = in_RSI, bVar1 = anon_unknown.dwarf_2b0f8::IsInt(6.34869908315189e-318), bVar1))
      && (uVar2 = (ulong)*local_18,
         uVar2 = (uVar2 | (long)(*local_18 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f) + 1,
         local_30 = uVar2, uVar2 != 0)) &&
     (sVar3 = ArraySize((Table *)CONCAT17(in_stack_ffffffffffffff97,
                                          CONCAT16(in_stack_ffffffffffffff96,
                                                   in_stack_ffffffffffffff90))), uVar2 <= sVar3)) {
    auVar6._8_4_ = (int)(local_30 >> 0x20);
    auVar6._0_8_ = local_30;
    auVar6._12_4_ = 0x45300000;
    local_20->num_ =
         (auVar6._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)local_30) - 4503599627370496.0);
    *(undefined4 *)(local_20 + 1) = 2;
    this_00 = std::
              unique_ptr<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
              ::operator*((unique_ptr<std::vector<luna::Value,_std::allocator<luna::Value>_>,_std::default_delete<std::vector<luna::Value,_std::allocator<luna::Value>_>_>_>
                           *)CONCAT17(in_stack_ffffffffffffff97,
                                      CONCAT16(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90))
                         );
    pvVar4 = std::vector<luna::Value,_std::allocator<luna::Value>_>::operator[]
                       (this_00,local_30 - 1);
    *local_28 = pvVar4->field_0;
    *(ValueT *)(local_28 + 1) = pvVar4->type_;
    return true;
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                      *)0x139c77);
  if (bVar1) {
    std::
    unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
    ::operator->((unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                  *)0x139c8e);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
         ::find(in_stack_ffffffffffffff88,(key_type *)0x139c9b);
    std::
    unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
    ::operator->((unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                  *)0x139cae);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
         ::end(in_stack_ffffffffffffff88);
    bVar1 = std::__detail::operator==(&local_38,&local_40);
    bVar8 = 0;
    if (bVar1) {
      std::
      unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
      ::operator->((unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                    *)0x139ce7);
      bVar1 = std::
              unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
              ::empty((unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
                       *)0x139cef);
      bVar8 = bVar1 ^ 0xff;
    }
    if ((bVar8 & 1) != 0) {
      std::
      unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
      ::operator->((unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                    *)0x139d0d);
      local_48._M_cur =
           (__node_type *)
           std::
           unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
           ::begin(in_stack_ffffffffffffff88);
      local_38._M_cur = local_48._M_cur;
      ppVar5 = std::__detail::_Node_iterator<std::pair<const_luna::Value,_luna::Value>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_luna::Value,_luna::Value>,_false,_true>
                             *)0x139d2e);
      *local_20 = (ppVar5->first).field_0;
      *(ValueT *)(local_20 + 1) = (ppVar5->first).type_;
      ppVar5 = std::__detail::_Node_iterator<std::pair<const_luna::Value,_luna::Value>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_luna::Value,_luna::Value>,_false,_true>
                             *)0x139d4c);
      *local_28 = (ppVar5->second).field_0;
      *(ValueT *)(local_28 + 1) = (ppVar5->second).type_;
      return true;
    }
    std::
    unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
    ::operator->((unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                  *)0x139d79);
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
         ::end(in_stack_ffffffffffffff88);
    bVar1 = std::__detail::operator!=(&local_38,&local_50);
    bVar7 = false;
    if (bVar1) {
      this_01 = (unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
                 *)std::__detail::
                   _Node_iterator<std::pair<const_luna::Value,_luna::Value>,_false,_true>::
                   operator++((_Node_iterator<std::pair<const_luna::Value,_luna::Value>,_false,_true>
                               *)CONCAT17(bVar8,(uint7)in_stack_ffffffffffffff90));
      std::
      unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
      ::operator->((unique_ptr<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>,_std::default_delete<std::unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>_>_>
                    *)0x139dc0);
      local_58._M_cur =
           (__node_type *)
           std::
           unordered_map<luna::Value,_luna::Value,_std::hash<luna::Value>,_std::equal_to<luna::Value>,_std::allocator<std::pair<const_luna::Value,_luna::Value>_>_>
           ::end(this_01);
      bVar7 = std::__detail::operator!=
                        ((_Node_iterator_base<std::pair<const_luna::Value,_luna::Value>,_true> *)
                         this_01,&local_58);
    }
    if (bVar7 != false) {
      ppVar5 = std::__detail::_Node_iterator<std::pair<const_luna::Value,_luna::Value>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_luna::Value,_luna::Value>,_false,_true>
                             *)0x139df3);
      *local_20 = (ppVar5->first).field_0;
      *(ValueT *)(local_20 + 1) = (ppVar5->first).type_;
      ppVar5 = std::__detail::_Node_iterator<std::pair<const_luna::Value,_luna::Value>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_luna::Value,_luna::Value>,_false,_true>
                             *)0x139e11);
      *local_28 = (ppVar5->second).field_0;
      *(ValueT *)(local_28 + 1) = (ppVar5->second).type_;
      return true;
    }
  }
  return false;
}

Assistant:

bool Table::NextKeyValue(const Value &key, Value &next_key, Value &next_value)
    {
        // array part
        if (key.type_ == ValueT_Number && IsInt(key.num_))
        {
            std::size_t index = static_cast<std::size_t>(key.num_) + 1;
            if (index >= 1 && index <= ArraySize())
            {
                next_key.num_ = index;
                next_key.type_ = ValueT_Number;
                next_value = (*array_)[index - 1];
                return true;
            }
        }

        // hash part
        if (hash_)
        {
            auto it = hash_->find(key);
            if (it == hash_->end() && !hash_->empty())
            {
                it = hash_->begin();
                next_key = it->first;
                next_value = it->second;
                return true;
            }

            if (it != hash_->end() && ++it != hash_->end())
            {
                next_key = it->first;
                next_value = it->second;
                return true;
            }
        }

        return false;
    }